

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O1

void non_empty_opendir_cb(uv_fs_t *req)

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = opendir_req.ptr;
  if (req == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_001587f9;
    if (opendir_req.result != 0) goto LAB_001587fe;
    if (opendir_req.ptr == (void *)0x0) goto LAB_00158803;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)pvVar1 + 8) = 1;
    req = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_fs_readdir((uv_loop_t *)req,&readdir_req,(uv_dir_t *)pvVar1,non_empty_readdir_cb);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&opendir_req);
      non_empty_opendir_cb_count = non_empty_opendir_cb_count + 1;
      return;
    }
  }
  else {
    non_empty_opendir_cb_cold_1();
LAB_001587f9:
    non_empty_opendir_cb_cold_2();
LAB_001587fe:
    non_empty_opendir_cb_cold_3();
LAB_00158803:
    non_empty_opendir_cb_cold_5();
  }
  non_empty_opendir_cb_cold_4();
  pvVar1 = readdir_req.ptr;
  if (req == &readdir_req) {
    if (readdir_req.fs_type != UV_FS_READDIR) goto LAB_00158869;
    if (readdir_req.result != 0) goto LAB_0015886e;
    uv_fs_req_cleanup(&readdir_req);
    req = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_fs_closedir((uv_loop_t *)req,&closedir_req,(uv_dir_t *)pvVar1,empty_closedir_cb);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    empty_readdir_cb_cold_1();
LAB_00158869:
    empty_readdir_cb_cold_2();
LAB_0015886e:
    empty_readdir_cb_cold_3();
  }
  empty_readdir_cb_cold_4();
  if (req == &closedir_req) {
    if (closedir_req.fs_type == UV_FS_CLOSEDIR) {
      if (closedir_req.result == 0) {
        empty_closedir_cb_count = empty_closedir_cb_count + 1;
        uv_fs_req_cleanup(&closedir_req);
        return;
      }
      goto LAB_001588b5;
    }
  }
  else {
    empty_closedir_cb_cold_1();
  }
  empty_closedir_cb_cold_2();
LAB_001588b5:
  empty_closedir_cb_cold_3();
  iVar2 = uv_is_closing((uv_handle_t *)req);
  if (iVar2 != 0) {
    return;
  }
  uv_close((uv_handle_t *)req,(uv_close_cb)0x0);
  return;
}

Assistant:

static void non_empty_opendir_cb(uv_fs_t* req) {
  uv_dir_t* dir;
  int r;

  ASSERT(req == &opendir_req);
  ASSERT(req->fs_type == UV_FS_OPENDIR);
  ASSERT(req->result == 0);
  ASSERT(req->ptr != NULL);

  dir = req->ptr;
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);

  r = uv_fs_readdir(uv_default_loop(),
                    &readdir_req,
                    dir,
                    non_empty_readdir_cb);
  ASSERT(r == 0);
  uv_fs_req_cleanup(req);
  ++non_empty_opendir_cb_count;
}